

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.h
# Opt level: O3

void __thiscall tvm::runtime::GraphRuntime::Load(GraphRuntime *this,JSONReader *reader)

{
  pointer puVar1;
  pointer pNVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  LogCheckError _check_err;
  string key;
  uint local_20c;
  LogCheckError local_208;
  GraphAttr *local_200;
  vector<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
  *local_1f8;
  vector<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>
  *local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_1e8;
  string local_1e0;
  int local_1bc;
  LogMessageFatal local_1b8;
  
  dmlc::JSONReader::BeginObject(reader);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_200 = &this->attrs_;
  local_1f0 = &this->outputs_;
  local_1e8 = &this->node_row_ptr_;
  local_1f8 = &this->nodes_;
  local_20c = 0;
  while( true ) {
    bVar3 = dmlc::JSONReader::NextObjectItem(reader,&local_1e0);
    if (!bVar3) break;
    iVar4 = std::__cxx11::string::compare((char *)&local_1e0);
    if (iVar4 == 0) {
      dmlc::json::
      ArrayHandler<std::vector<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>_>
      ::Read(reader,local_1f8);
      local_20c = local_20c | 1;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_1e0);
      if (iVar4 == 0) {
        puVar1 = (this->input_nodes_).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar1) {
          (this->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar1;
        }
        dmlc::JSONReader::BeginArray(reader);
        bVar3 = dmlc::JSONReader::NextArrayItem(reader);
        while (bVar3 != false) {
          dmlc::JSONReader::ReadNumber<unsigned_int>(reader,(uint *)&local_1b8);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                    (&this->input_nodes_,
                     (const_iterator)
                     (this->input_nodes_).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(value_type_conflict2 *)&local_1b8);
          bVar3 = dmlc::JSONReader::NextArrayItem(reader);
        }
        local_20c = local_20c | 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_1e0);
        if (iVar4 == 0) {
          puVar1 = (this->node_row_ptr_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->node_row_ptr_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish != puVar1) {
            (this->node_row_ptr_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar1;
          }
          dmlc::JSONReader::BeginArray(reader);
          bVar3 = dmlc::JSONReader::NextArrayItem(reader);
          while (bVar3 != false) {
            dmlc::JSONReader::ReadNumber<unsigned_int>(reader,(uint *)&local_1b8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                      (local_1e8,
                       (const_iterator)
                       (this->node_row_ptr_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(value_type_conflict2 *)&local_1b8);
            bVar3 = dmlc::JSONReader::NextArrayItem(reader);
          }
          local_20c = local_20c | 4;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_1e0);
          if (iVar4 == 0) {
            pNVar2 = (this->outputs_).
                     super__Vector_base<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((this->outputs_).
                super__Vector_base<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish != pNVar2) {
              (this->outputs_).
              super__Vector_base<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish = pNVar2;
            }
            dmlc::JSONReader::BeginArray(reader);
            bVar3 = dmlc::JSONReader::NextArrayItem(reader);
            while (bVar3 != false) {
              NodeEntry::Load((NodeEntry *)&local_1b8,reader);
              std::
              vector<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>
              ::insert(local_1f0,
                       (this->outputs_).
                       super__Vector_base<tvm::runtime::GraphRuntime::NodeEntry,_std::allocator<tvm::runtime::GraphRuntime::NodeEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(value_type *)&local_1b8);
              bVar3 = dmlc::JSONReader::NextArrayItem(reader);
            }
            local_20c = local_20c | 8;
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_1e0);
            if (iVar4 == 0) {
              GraphAttr::Load(local_200,reader);
              local_20c = local_20c | 0x10;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_1e0);
              if (iVar4 == 0) break;
              dmlc::LogMessageFatal::LogMessageFatal
                        (&local_1b8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/graph/graph_runtime.h"
                         ,0x16c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"key ",4);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&local_1b8,local_1e0._M_dataplus._M_p,
                                  local_1e0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not supported",0x11);
              dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
            }
          }
        }
      }
    }
  }
  local_1b8._0_4_ = local_20c;
  local_1bc = 0x1f;
  dmlc::LogCheck_EQ<int,int>((dmlc *)&local_208,(int *)&local_1b8,&local_1bc);
  if (local_208.str != (string *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/./tvm/src/runtime/graph/graph_runtime.h"
               ,0x16f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"bitmask == 1|2|4|8|16",0x15);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1b8,((local_208.str)->_M_dataplus)._M_p,
                        (local_208.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"invalid format",0xe);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  dmlc::LogCheckError::~LogCheckError(&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Load(dmlc::JSONReader *reader) {
      reader->BeginObject();
      int bitmask = 0;
      std::string key;
      while (reader->NextObjectItem(&key)) {
        if (key == "nodes") {
          reader->Read(&nodes_);
          bitmask |= 1;
        } else if (key == "arg_nodes") {
          reader->Read(&input_nodes_);
          bitmask |= 2;
        } else if (key == "node_row_ptr") {
          reader->Read(&node_row_ptr_);
          bitmask |= 4;
        } else if (key == "heads") {
          reader->Read(&outputs_);
          bitmask |= 8;
        } else if (key == "attrs") {
          reader->Read(&attrs_);
          bitmask |= 16;
        } else if (key == "metadata") {
          break;
        } else {
          LOG(FATAL) << "key " << key << " is not supported";
        }
      }
      CHECK_EQ(bitmask, 1|2|4|8|16) << "invalid format";
  }